

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O1

VmValue * CompileVmVariableDefinition
                    (ExpressionContext *ctx,VmModule *module,ExprVariableDefinition *node)

{
  VariableData *source;
  Allocator *pAVar1;
  bool bVar2;
  int iVar3;
  VariableData *variable;
  VmConstant *pVVar4;
  undefined4 extraout_var;
  VmValue *pVVar5;
  VmConstant *el1;
  VmConstant *el2;
  TypeBase *in_RCX;
  TypeBase *type;
  SynBase *pSVar6;
  VmValueType VVar7;
  ulong uVar8;
  VmType type_00;
  SynBase *local_48;
  
  if (node->initializer != (ExprBase *)0x0) {
    CompileVm(ctx,module,node->initializer);
    goto LAB_00284b4a;
  }
  source = node->variable->variable;
  if (((source->isVmAlloca != false) || (source->lookupOnly != false)) ||
     (bVar2 = IsLocalScope(source->scope), !bVar2)) goto LAB_00284b4a;
  type_00 = GetVmType(ctx,(TypeBase *)((InplaceStr *)&source->type)->begin);
  variable = (VariableData *)
             ExpressionContext::GetReferenceType
                       (ctx,(TypeBase *)((InplaceStr *)&source->type)->begin);
  pVVar5 = anon_unknown.dwarf_233176::CreateVariableAddress
                     (module,(SynBase *)source,variable,in_RCX);
  VVar7 = type_00.type;
  uVar8 = type_00._0_8_ >> 0x20;
  if ((VVar7 == VM_TYPE_INT && uVar8 == 4) ||
     ((VVar7 & ~VM_TYPE_INT) == VM_TYPE_DOUBLE && type_00.size == 8)) {
    pVVar4 = CreateConstantZero(ctx->allocator,(node->super_ExprBase).source,type_00);
LAB_00284b2a:
    pSVar6 = (node->super_ExprBase).source;
    type = (TypeBase *)((InplaceStr *)&source->type)->begin;
    goto LAB_00284b42;
  }
  switch(VVar7) {
  case VM_TYPE_POINTER:
    pVVar4 = CreateConstantPointer
                       (module->allocator,(node->super_ExprBase).source,0,(VariableData *)0x0,
                        (TypeBase *)((InplaceStr *)&source->type)->begin,false);
    goto LAB_00284b2a;
  case VM_TYPE_FUNCTION_REF:
  case VM_TYPE_ARRAY_REF:
    local_48 = (node->super_ExprBase).source;
    pVVar4 = CreateConstantPointer
                       (module->allocator,local_48,0,(VariableData *)0x0,ctx->typeNullPtr,false);
    el1 = CreateConstantInt(module->allocator,(node->super_ExprBase).source,0);
    break;
  case VM_TYPE_AUTO_REF:
    local_48 = (node->super_ExprBase).source;
    pVVar4 = CreateConstantInt(module->allocator,local_48,0);
    el1 = CreateConstantPointer
                    (module->allocator,(node->super_ExprBase).source,0,(VariableData *)0x0,
                     ctx->typeNullPtr,false);
    break;
  case VM_TYPE_AUTO_ARRAY:
    local_48 = (node->super_ExprBase).source;
    pVVar4 = CreateConstantInt(module->allocator,local_48,0);
    el1 = CreateConstantPointer
                    (module->allocator,(node->super_ExprBase).source,0,(VariableData *)0x0,
                     ctx->typeNullPtr,false);
    el2 = CreateConstantInt(module->allocator,(node->super_ExprBase).source,0);
    goto LAB_00284d22;
  case VM_TYPE_STRUCT:
    if (uVar8 != 0) {
      pSVar6 = (node->super_ExprBase).source;
      pVVar4 = CreateConstantZero(ctx->allocator,pSVar6,(VmType)ZEXT816(0x400000001));
      anon_unknown.dwarf_233176::CreateSetRange
                (module,pSVar6,pVVar5,type_00.size >> 2,&pVVar4->super_VmValue,4);
    }
    goto LAB_00284b4a;
  default:
    if ((uVar8 != 0) || (VVar7 != VM_TYPE_VOID)) {
      __assert_fail("!\"unknown type\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0xd72,
                    "VmValue *CompileVmVariableDefinition(ExpressionContext &, VmModule *, ExprVariableDefinition *)"
                   );
    }
    goto LAB_00284b4a;
  }
  el2 = (VmConstant *)0x0;
LAB_00284d22:
  pVVar4 = (VmConstant *)
           anon_unknown.dwarf_233176::CreateConstruct
                     (module,local_48,type_00,&pVVar4->super_VmValue,&el1->super_VmValue,
                      &el2->super_VmValue,&pVVar4->super_VmValue);
  pSVar6 = (node->super_ExprBase).source;
  type = (TypeBase *)((InplaceStr *)&source->type)->begin;
LAB_00284b42:
  anon_unknown.dwarf_233176::CreateStore(ctx,module,pSVar6,type,pVVar5,&pVVar4->super_VmValue,0);
LAB_00284b4a:
  iVar3 = (*module->allocator->_vptr_Allocator[2])(module->allocator,0x98);
  pVVar5 = (VmValue *)CONCAT44(extraout_var,iVar3);
  pAVar1 = module->allocator;
  pVVar5->typeID = 0;
  pVVar5->source = (SynBase *)0x0;
  (pVVar5->comment).begin = (char *)0x0;
  (pVVar5->type).type = VM_TYPE_VOID;
  (pVVar5->type).size = 0;
  (pVVar5->type).structType = (TypeBase *)0x0;
  (pVVar5->comment).end = (char *)0x0;
  (pVVar5->users).allocator = pAVar1;
  (pVVar5->users).data = (pVVar5->users).little;
  (pVVar5->users).count = 0;
  (pVVar5->users).max = 8;
  pVVar5->hasSideEffects = false;
  pVVar5->hasMemoryAccess = false;
  pVVar5->canBeRemoved = true;
  pVVar5->hasKnownSimpleUse = false;
  pVVar5->hasKnownNonSimpleUse = false;
  pVVar5->_vptr_VmValue = (_func_int **)&PTR__VmValue_003f8c60;
  pVVar5 = anon_unknown.dwarf_233176::CheckType(ctx,&node->super_ExprBase,pVVar5);
  return pVVar5;
}

Assistant:

VmValue* CompileVmVariableDefinition(ExpressionContext &ctx, VmModule *module, ExprVariableDefinition *node)
{
	VariableData *variable = node->variable->variable;

	if(node->initializer)
	{
		CompileVm(ctx, module, node->initializer);
	}
	else if(!variable->isVmAlloca && !variable->lookupOnly && IsLocalScope(variable->scope))
	{
		VmType vmType = GetVmType(ctx, variable->type);

		VmValue *address = CreateVariableAddress(module, node->source, variable, ctx.GetReferenceType(variable->type));

		if(vmType == VmType::Int || vmType == VmType::Double || vmType == VmType::Long)
		{
			VmValue *initializer = CreateConstantZero(ctx.allocator, node->source, vmType);

			CreateStore(ctx, module, node->source, variable->type, address, initializer, 0);
		}
		else if(vmType.type == VM_TYPE_POINTER)
		{
			VmValue *initializer = CreateConstantPointer(module->allocator, node->source, 0, NULL, variable->type, false);

			CreateStore(ctx, module, node->source, variable->type, address, initializer, 0);
		}
		else if(vmType.type == VM_TYPE_FUNCTION_REF)
		{
			VmValue *initializer = CreateConstruct(module, node->source, vmType, CreateConstantPointer(module->allocator, node->source, 0, NULL, ctx.typeNullPtr, false), CreateConstantInt(module->allocator, node->source, 0), NULL, NULL);

			CreateStore(ctx, module, node->source, variable->type, address, initializer, 0);
		}
		else if(vmType.type == VM_TYPE_ARRAY_REF)
		{
			VmValue *initializer = CreateConstruct(module, node->source, vmType, CreateConstantPointer(module->allocator, node->source, 0, NULL, ctx.typeNullPtr, false), CreateConstantInt(module->allocator, node->source, 0), NULL, NULL);

			CreateStore(ctx, module, node->source, variable->type, address, initializer, 0);
		}
		else if(vmType.type == VM_TYPE_AUTO_REF)
		{
			VmValue *initializer = CreateConstruct(module, node->source, vmType, CreateConstantInt(module->allocator, node->source, 0), CreateConstantPointer(module->allocator, node->source, 0, NULL, ctx.typeNullPtr, false), NULL, NULL);

			CreateStore(ctx, module, node->source, variable->type, address, initializer, 0);
		}
		else if(vmType.type == VM_TYPE_AUTO_ARRAY)
		{
			VmValue *initializer = CreateConstruct(module, node->source, vmType, CreateConstantInt(module->allocator, node->source, 0), CreateConstantPointer(module->allocator, node->source, 0, NULL, ctx.typeNullPtr, false), CreateConstantInt(module->allocator, node->source, 0), NULL);

			CreateStore(ctx, module, node->source, variable->type, address, initializer, 0);
		}
		else if(vmType.type == VM_TYPE_STRUCT)
		{
			if(vmType.size != 0)
				CreateSetRange(module, node->source, address, vmType.size / 4, CreateConstantZero(ctx.allocator, node->source, VmType::Int), 4);
		}
		else if(vmType != VmType::Void)
		{
			assert(!"unknown type");
		}
	}

	return CheckType(ctx, node, CreateVoid(module));
}